

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip6.c
# Opt level: O2

Curl_addrinfo * Curl_getaddrinfo(connectdata *conn,char *hostname,int port,int *waitp)

{
  Curl_easy *data;
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  char *buffer;
  Curl_addrinfo *res;
  addrinfo hints;
  char sbuf [12];
  char addrbuf [128];
  
  data = conn->data;
  *waitp = 0;
  if (conn->ip_version == 1) {
    uVar2 = 2;
  }
  else {
    if (conn->ip_version == 2) {
      uVar4 = 10;
    }
    else {
      uVar4 = 0;
    }
    _Var1 = Curl_ipv6works();
    uVar2 = 2;
    if (_Var1) {
      uVar2 = uVar4;
    }
  }
  hints.ai_canonname = (char *)0x0;
  hints.ai_next = (addrinfo *)0x0;
  hints.ai_addrlen = 0;
  hints._20_4_ = 0;
  hints.ai_addr = (sockaddr *)0x0;
  hints._0_8_ = (ulong)uVar2 << 0x20;
  hints.ai_protocol = 0;
  hints.ai_socktype = conn->socktype;
  iVar3 = inet_pton(2,hostname,addrbuf);
  if ((iVar3 == 1) || (iVar3 = inet_pton(10,hostname,addrbuf), iVar3 == 1)) {
    hints.ai_flags = 4;
  }
  if (port == 0) {
    buffer = (char *)0x0;
  }
  else {
    buffer = sbuf;
    curl_msnprintf(buffer,0xc,"%d",(ulong)(uint)port);
  }
  iVar3 = Curl_getaddrinfo_ex(hostname,buffer,&hints,&res);
  if (iVar3 != 0) {
    Curl_infof(data,"getaddrinfo(3) failed for %s:%d\n",hostname,(ulong)(uint)port);
    res = (Curl_addrinfo *)0x0;
  }
  return res;
}

Assistant:

Curl_addrinfo *Curl_getaddrinfo(struct connectdata *conn,
                                const char *hostname,
                                int port,
                                int *waitp)
{
  struct addrinfo hints;
  Curl_addrinfo *res;
  int error;
  char sbuf[12];
  char *sbufptr = NULL;
#ifndef USE_RESOLVE_ON_IPS
  char addrbuf[128];
#endif
  int pf;
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
  struct Curl_easy *data = conn->data;
#endif

  *waitp = 0; /* synchronous response only */

  /* Check if a limited name resolve has been requested */
  switch(conn->ip_version) {
  case CURL_IPRESOLVE_V4:
    pf = PF_INET;
    break;
  case CURL_IPRESOLVE_V6:
    pf = PF_INET6;
    break;
  default:
    pf = PF_UNSPEC;
    break;
  }

  if((pf != PF_INET) && !Curl_ipv6works())
    /* The stack seems to be a non-IPv6 one */
    pf = PF_INET;

  memset(&hints, 0, sizeof(hints));
  hints.ai_family = pf;
  hints.ai_socktype = conn->socktype;

#ifndef USE_RESOLVE_ON_IPS
  /*
   * The AI_NUMERICHOST must not be set to get synthesized IPv6 address from
   * an IPv4 address on iOS and Mac OS X.
   */
  if((1 == Curl_inet_pton(AF_INET, hostname, addrbuf)) ||
     (1 == Curl_inet_pton(AF_INET6, hostname, addrbuf))) {
    /* the given address is numerical only, prevent a reverse lookup */
    hints.ai_flags = AI_NUMERICHOST;
  }
#endif

  if(port) {
    snprintf(sbuf, sizeof(sbuf), "%d", port);
    sbufptr = sbuf;
  }

  error = Curl_getaddrinfo_ex(hostname, sbufptr, &hints, &res);
  if(error) {
    infof(data, "getaddrinfo(3) failed for %s:%d\n", hostname, port);
    return NULL;
  }

  if(port) {
    Curl_addrinfo_set_port(res, port);
  }

  dump_addrinfo(conn, res);

  return res;
}